

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O3

int __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::numBasicSubobjectsInElementType(IOBlock *this)

{
  pointer pMVar1;
  int iVar2;
  VarType *type;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  pMVar1 = (this->m_members).
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (int)((long)(this->m_members).
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 3) * -0x49249249;
  if ((int)uVar4 < 1) {
    iVar3 = 0;
  }
  else {
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    type = &pMVar1->type;
    iVar3 = 0;
    do {
      iVar2 = numBasicSubobjects(type);
      iVar3 = iVar3 + iVar2;
      type = (VarType *)&type[2].m_data;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return iVar3;
}

Assistant:

int IOBlock::numBasicSubobjectsInElementType (void) const
{
	int result = 0;
	for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
		result += numBasicSubobjects(m_members[i].type);
	return result;
}